

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void hash_commitment_x4_verify
               (picnic_instance_t *pp,proof_round_t *prf,sorting_helper_t *helper,uint vidx)

{
  uint8_t tmp [4] [64];
  hash_context_x4 ctx;
  proof_round_t *prf3;
  proof_round_t *prf2;
  proof_round_t *prf1;
  proof_round_t *prf0;
  uint hashlen;
  size_t in_stack_fffffffffffffb88;
  hash_context_x4 *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffba8;
  uint8_t *in_stack_fffffffffffffbb0;
  uint8_t *in_stack_fffffffffffffbb8;
  uint8_t *in_stack_fffffffffffffbc0;
  uint8_t *in_stack_fffffffffffffbc8;
  hash_context_x4 *in_stack_fffffffffffffbd0;
  
  hash_init_prefix_x4(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,'\0');
  hash_update_x4_4(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  hash_final_x4((hash_context_x4 *)0x13fe20);
  hash_squeeze_x4_4(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  hash_init_prefix_x4(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,'\0');
  hash_update_x4_4(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  hash_update_x4_4(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  hash_update_x4_4(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  hash_update_x4_4(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                   in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  hash_final_x4((hash_context_x4 *)0x13fff3);
  hash_squeeze_x4_4(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                    in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  return;
}

Assistant:

static void hash_commitment_x4_verify(const picnic_instance_t* pp, const proof_round_t* prf,
                                      const sorting_helper_t* helper, const unsigned int vidx) {
  const unsigned int hashlen = pp->digest_size;

  const proof_round_t* prf0 = &prf[helper[0]];
  const proof_round_t* prf1 = &prf[helper[1]];
  const proof_round_t* prf2 = &prf[helper[2]];
  const proof_round_t* prf3 = &prf[helper[3]];

  hash_context_x4 ctx;
  // hash the seed
  hash_init_prefix_x4(&ctx, hashlen, HASH_PREFIX_4);
  hash_update_x4_4(&ctx, prf0->seeds[vidx], prf1->seeds[vidx], prf2->seeds[vidx], prf3->seeds[vidx],
                   pp->seed_size);
  hash_final_x4(&ctx);
  uint8_t tmp[4][MAX_DIGEST_SIZE];
  hash_squeeze_x4_4(&ctx, tmp[0], tmp[1], tmp[2], tmp[3], hashlen);
  hash_clear_x4(&ctx);

  // compute H_0(H_4(seed), view)
  hash_init_prefix_x4(&ctx, hashlen, HASH_PREFIX_0);
  hash_update_x4_4(&ctx, tmp[0], tmp[1], tmp[2], tmp[3], hashlen);
  // hash input share
  hash_update_x4_4(&ctx, prf0->input_shares[vidx], prf1->input_shares[vidx],
                   prf2->input_shares[vidx], prf3->input_shares[vidx], pp->input_output_size);
  // hash communicated bits
  hash_update_x4_4(&ctx, prf0->communicated_bits[vidx], prf1->communicated_bits[vidx],
                   prf2->communicated_bits[vidx], prf3->communicated_bits[vidx], pp->view_size);
  // hash output share
  hash_update_x4_4(&ctx, prf0->output_shares[vidx], prf1->output_shares[vidx],
                   prf2->output_shares[vidx], prf3->output_shares[vidx], pp->input_output_size);
  hash_final_x4(&ctx);
  hash_squeeze_x4_4(&ctx, prf0->commitments[vidx], prf1->commitments[vidx], prf2->commitments[vidx],
                    prf3->commitments[vidx], hashlen);
  hash_clear_x4(&ctx);
}